

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O2

int kws_search_finish(ps_search_t *search)

{
  int iVar1;
  long lVar2;
  double dVar3;
  
  *(int *)&search[2].type = *(int *)&search[2].type + *(int *)&search[1].pls;
  ptmr_stop((ptmr_t *)&search[1].hyp_str);
  iVar1 = search->acmod->output_frame;
  if (0 < iVar1) {
    lVar2 = ps_config_int(search->config,"frate");
    dVar3 = (double)(iVar1 + 1) / (double)lVar2;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_search.c"
            ,0x298,"kws %.2f CPU %.3f xRT\n",search[1].dag,(double)search[1].dag / dVar3);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_search.c"
            ,0x29a,"kws %.2f wall %.3f xRT\n",search[1].last_link,
            (double)search[1].last_link / dVar3);
  }
  return 0;
}

Assistant:

int
kws_search_finish(ps_search_t * search)
{
    kws_search_t *kwss;
    int32 cf;

    kwss = (kws_search_t *) search;

    kwss->n_tot_frame += kwss->frame;

    /* Print out some statistics. */
    ptmr_stop(&kwss->perf);
    /* This is the number of frames processed. */
    cf = ps_search_acmod(kwss)->output_frame;
    if (cf > 0) {
        double n_speech = (double) (cf + 1)
            / ps_config_int(ps_search_config(kwss), "frate");
        E_INFO("kws %.2f CPU %.3f xRT\n",
               kwss->perf.t_cpu, kwss->perf.t_cpu / n_speech);
        E_INFO("kws %.2f wall %.3f xRT\n",
               kwss->perf.t_elapsed, kwss->perf.t_elapsed / n_speech);
    }

    return 0;
}